

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

GLSLVersion glu::getContextTypeGLSLVersion(ContextType type)

{
  bool bVar1;
  GLSLVersion local_14;
  int version;
  ContextType type_local;
  
  local_14 = GLSL_VERSION_450;
  while( true ) {
    if ((int)local_14 < 0) {
      return GLSL_VERSION_LAST;
    }
    bVar1 = isGLSLVersionSupported(type,local_14);
    if (bVar1) break;
    local_14 = local_14 - GLSL_VERSION_300_ES;
  }
  return local_14;
}

Assistant:

GLSLVersion getContextTypeGLSLVersion (ContextType type)
{
	// \note From newer to older
	for (int version = GLSL_VERSION_LAST-1; version >= 0; version--)
	{
		if (isGLSLVersionSupported(type, GLSLVersion(version)))
			return GLSLVersion(version);
	}

	DE_ASSERT(false);
	return GLSL_VERSION_LAST;
}